

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nwkFanio.c
# Opt level: O2

void Nwk_ObjPatchFanin(Nwk_Obj_t *pObj,Nwk_Obj_t *pFaninOld,Nwk_Obj_t *pFaninNew)

{
  int iVar1;
  Nwk_Obj_t *pNVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  
  if (pFaninOld == pFaninNew) {
    __assert_fail("pFaninOld != pFaninNew",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/nwk/nwkFanio.c"
                  ,0xea,"void Nwk_ObjPatchFanin(Nwk_Obj_t *, Nwk_Obj_t *, Nwk_Obj_t *)");
  }
  if (pObj == pFaninOld) {
    __assert_fail("pObj != pFaninOld",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/nwk/nwkFanio.c"
                  ,0xeb,"void Nwk_ObjPatchFanin(Nwk_Obj_t *, Nwk_Obj_t *, Nwk_Obj_t *)");
  }
  if (pObj == pFaninNew) {
    __assert_fail("pObj != pFaninNew",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/nwk/nwkFanio.c"
                  ,0xec,"void Nwk_ObjPatchFanin(Nwk_Obj_t *, Nwk_Obj_t *, Nwk_Obj_t *)");
  }
  if (pObj->pMan == pFaninOld->pMan) {
    if (pObj->pMan != pFaninNew->pMan) {
      __assert_fail("pObj->pMan == pFaninNew->pMan",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/nwk/nwkFanio.c"
                    ,0xee,"void Nwk_ObjPatchFanin(Nwk_Obj_t *, Nwk_Obj_t *, Nwk_Obj_t *)");
    }
    iVar3 = Nwk_ObjFindFanin(pObj,pFaninOld);
    if (iVar3 != -1) {
      pObj->pFanio[iVar3] = pFaninNew;
      iVar4 = pFaninOld->nFanins;
      iVar1 = pFaninOld->nFanouts;
      iVar3 = iVar1 + iVar4;
      for (lVar5 = (long)iVar4; lVar5 < iVar3; lVar5 = lVar5 + 1) {
        pNVar2 = pFaninOld->pFanio[lVar5];
        if (pNVar2 != pObj) {
          lVar6 = (long)iVar4;
          iVar4 = iVar4 + 1;
          pFaninOld->pFanio[lVar6] = pNVar2;
        }
      }
      pFaninOld->nFanouts = iVar1 + -1;
      iVar3 = pFaninNew->nFanouts;
      iVar4 = pFaninNew->nFanins + iVar3;
      if (iVar4 == pFaninNew->nFanioAlloc) {
        Nwk_ManReallocNode(pFaninNew);
        iVar3 = pFaninNew->nFanouts;
        iVar4 = pFaninNew->nFanins + iVar3;
      }
      pFaninNew->nFanouts = iVar3 + 1;
      pFaninNew->pFanio[iVar4] = pObj;
      return;
    }
    printf("Nwk_ObjPatchFanin(); Error! Node %d is not among",(ulong)(uint)pFaninOld->Id);
    printf(" the fanins of node %d...\n",(ulong)(uint)pObj->Id);
    return;
  }
  __assert_fail("pObj->pMan == pFaninOld->pMan",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/nwk/nwkFanio.c"
                ,0xed,"void Nwk_ObjPatchFanin(Nwk_Obj_t *, Nwk_Obj_t *, Nwk_Obj_t *)");
}

Assistant:

void Nwk_ObjPatchFanin( Nwk_Obj_t * pObj, Nwk_Obj_t * pFaninOld, Nwk_Obj_t * pFaninNew )
{
    int i, k, iFanin, Limit;
    assert( pFaninOld != pFaninNew );
    assert( pObj != pFaninOld );
    assert( pObj != pFaninNew );
    assert( pObj->pMan == pFaninOld->pMan );
    assert( pObj->pMan == pFaninNew->pMan );
    // update the fanin
    iFanin = Nwk_ObjFindFanin( pObj, pFaninOld );
    if ( iFanin == -1 )
    {
        printf( "Nwk_ObjPatchFanin(); Error! Node %d is not among", pFaninOld->Id );
        printf( " the fanins of node %d...\n", pObj->Id );
        return;
    }
    pObj->pFanio[iFanin] = pFaninNew;
    // remove pObj from the fanout list of pFaninOld
    Limit = pFaninOld->nFanins + pFaninOld->nFanouts;
    for ( k = i = pFaninOld->nFanins; i < Limit; i++ )
        if ( pFaninOld->pFanio[i] != pObj )
            pFaninOld->pFanio[k++] = pFaninOld->pFanio[i];
    pFaninOld->nFanouts--;
    // add pObj to the fanout list of pFaninNew
    if ( Nwk_ObjReallocIsNeeded(pFaninNew) )
        Nwk_ManReallocNode( pFaninNew );
    pFaninNew->pFanio[pFaninNew->nFanins + pFaninNew->nFanouts++] = pObj;
}